

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int sam_format1(bam_hdr_t *h,bam1_t *b,kstring_t *str)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  uint uVar5;
  bam1_core_t *pbVar6;
  bool bVar7;
  char local_53;
  undefined1 local_52;
  byte local_51;
  int32_t n;
  uint8_t sub_type;
  uint8_t key [2];
  uint8_t type;
  uint8_t *s_1;
  uint32_t *cigar;
  bam1_core_t *c;
  uint8_t *s;
  int i;
  kstring_t *str_local;
  bam1_t *b_local;
  bam_hdr_t *h_local;
  
  str->l = 0;
  kputsn((char *)b->data,((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff) - 1,str
        );
  kputc(9,str);
  kputw((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x20) & 0xffff,str);
  kputc(9,str);
  if ((b->core).tid < 0) {
    kputsn("*\t",2,str);
  }
  else {
    kputs(h->target_name[(b->core).tid],str);
    kputc(9,str);
  }
  kputw((b->core).pos + 1,str);
  kputc(9,str);
  kputw((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x10) & 0xff,str);
  kputc(9,str);
  if ((short)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30) == 0) {
    kputc(0x2a,str);
  }
  else {
    puVar4 = b->data;
    uVar5 = (uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff;
    for (s._4_4_ = 0;
        (int)s._4_4_ < (int)(uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30);
        s._4_4_ = s._4_4_ + 1) {
      kputw(*(uint *)(puVar4 + (long)(int)s._4_4_ * 4 + (long)(int)uVar5) >> 4,str);
      kputc((int)"MIDNSHP=XB"[*(uint *)(puVar4 + (long)(int)s._4_4_ * 4 + (long)(int)uVar5) & 0xf],
            str);
    }
  }
  kputc(9,str);
  if ((b->core).mtid < 0) {
    kputsn("*\t",2,str);
  }
  else if ((b->core).mtid == (b->core).tid) {
    kputsn("=\t",2,str);
  }
  else {
    kputs(h->target_name[(b->core).mtid],str);
    kputc(9,str);
  }
  kputw((b->core).mpos + 1,str);
  kputc(9,str);
  kputw((b->core).isize,str);
  kputc(9,str);
  if ((b->core).l_qseq == 0) {
    kputsn("*\t*",3,str);
  }
  else {
    _n = b->data + (long)(int)((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff) +
                   (long)(int)((uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30) <<
                              2);
    for (s._4_4_ = 0; (int)s._4_4_ < (b->core).l_qseq; s._4_4_ = s._4_4_ + 1) {
      kputc((int)"=ACMGRSVTWYHKDBN"
                 [(int)((int)(uint)_n[(int)s._4_4_ >> 1] >>
                        (sbyte)(((s._4_4_ ^ 0xffffffff) & 1) << 2) & 0xf)],str);
    }
    kputc(9,str);
    _n = b->data + (long)((b->core).l_qseq + 1 >> 1) +
                   (long)(int)((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff) +
                   (long)(int)((uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30) <<
                              2);
    if (*_n == 0xff) {
      kputc(0x2a,str);
    }
    else {
      for (s._4_4_ = 0; (int)s._4_4_ < (b->core).l_qseq; s._4_4_ = s._4_4_ + 1) {
        kputc(_n[(int)s._4_4_] + 0x21,str);
      }
    }
  }
  pbVar6 = (bam1_core_t *)
           (b->data +
           (long)(b->core).l_qseq +
           (long)((b->core).l_qseq + 1 >> 1) +
           (long)(int)((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff) +
           (long)(int)((uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30) << 2));
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        c = pbVar6;
                        if (b->data + b->l_data < &c->pos) {
                          return (int)str->l;
                        }
                        local_53 = (char)c->tid;
                        local_52 = *(undefined1 *)((long)&c->tid + 1);
                        pbVar6 = (bam1_core_t *)((long)&c->tid + 3);
                        local_51 = *(byte *)((long)&c->tid + 2);
                        kputc(9,str);
                        kputsn(&local_53,2,str);
                        kputc(0x3a,str);
                        if (local_51 != 0x41) break;
                        kputsn("A:",2,str);
                        kputc((uint)(byte)pbVar6->tid,str);
                        pbVar6 = (bam1_core_t *)&c->pos;
                      }
                      if (local_51 != 0x43) break;
                      kputsn("i:",2,str);
                      kputw((uint)(byte)pbVar6->tid,str);
                      pbVar6 = (bam1_core_t *)&c->pos;
                    }
                    if (local_51 != 99) break;
                    kputsn("i:",2,str);
                    kputw((int)(char)pbVar6->tid,str);
                    pbVar6 = (bam1_core_t *)&c->pos;
                  }
                  if (local_51 != 0x53) break;
                  if (b->data + b->l_data < (uint8_t *)((long)&c->pos + 1U)) {
                    return -1;
                  }
                  kputsn("i:",2,str);
                  kputw((uint)(ushort)pbVar6->tid,str);
                  pbVar6 = (bam1_core_t *)((long)&c->pos + 1);
                }
                if (local_51 != 0x73) break;
                if (b->data + b->l_data < (uint8_t *)((long)&c->pos + 1U)) {
                  return -1;
                }
                kputsn("i:",2,str);
                kputw((int)(short)pbVar6->tid,str);
                pbVar6 = (bam1_core_t *)((long)&c->pos + 1);
              }
              if (local_51 != 0x49) break;
              if (b->data + b->l_data < (uint8_t *)((long)&c->pos + 3U)) {
                return -1;
              }
              kputsn("i:",2,str);
              kputuw(pbVar6->tid,str);
              pbVar6 = (bam1_core_t *)((long)&c->pos + 3);
            }
            if (local_51 != 0x69) break;
            if (b->data + b->l_data < (uint8_t *)((long)&c->pos + 3U)) {
              return -1;
            }
            kputsn("i:",2,str);
            kputw(pbVar6->tid,str);
            pbVar6 = (bam1_core_t *)((long)&c->pos + 3);
          }
          if (local_51 != 0x66) break;
          if (b->data + b->l_data < (uint8_t *)((long)&c->pos + 3U)) {
            return -1;
          }
          ksprintf(str,"f:%g",(double)(float)pbVar6->tid);
          pbVar6 = (bam1_core_t *)((long)&c->pos + 3);
        }
        if (local_51 != 100) break;
        if (b->data + b->l_data < &c->field_0xb) {
          return -1;
        }
        uVar1._0_4_ = pbVar6->tid;
        uVar1._4_4_ = pbVar6->pos;
        ksprintf(str,"d:%g",uVar1);
        pbVar6 = (bam1_core_t *)&c->field_0xb;
      }
      if ((local_51 == 0x5a) || (local_51 == 0x48)) break;
      if (local_51 == 0x42) {
        bVar2 = (byte)pbVar6->tid;
        iVar3 = c->pos;
        c = (bam1_core_t *)&c->field_0x8;
        if (b->data + b->l_data <= (uint8_t *)((long)c + (long)iVar3)) {
          return -1;
        }
        kputsn("B:",2,str);
        kputc((uint)bVar2,str);
        for (s._4_4_ = 0; pbVar6 = c, (int)s._4_4_ < iVar3; s._4_4_ = s._4_4_ + 1) {
          kputc(0x2c,str);
          if (bVar2 == 99) {
            kputw((int)(char)c->tid,str);
            c = (bam1_core_t *)((long)&c->tid + 1);
          }
          else if (bVar2 == 0x43) {
            kputw((uint)(byte)c->tid,str);
            c = (bam1_core_t *)((long)&c->tid + 1);
          }
          else if (bVar2 == 0x73) {
            kputw((int)(short)c->tid,str);
            c = (bam1_core_t *)((long)&c->tid + 2);
          }
          else if (bVar2 == 0x53) {
            kputw((uint)(ushort)c->tid,str);
            c = (bam1_core_t *)((long)&c->tid + 2);
          }
          else if (bVar2 == 0x69) {
            kputw(c->tid,str);
            c = (bam1_core_t *)&c->pos;
          }
          else if (bVar2 == 0x49) {
            kputuw(c->tid,str);
            c = (bam1_core_t *)&c->pos;
          }
          else if (bVar2 == 0x66) {
            ksprintf(str,"%g",(double)(float)c->tid);
            c = (bam1_core_t *)&c->pos;
          }
        }
      }
    }
    kputc((uint)local_51,str);
    kputc(0x3a,str);
    c = pbVar6;
    while( true ) {
      bVar7 = false;
      if (c < (bam1_core_t *)(b->data + b->l_data)) {
        bVar7 = (char)c->tid != '\0';
      }
      if (!bVar7) break;
      kputc((uint)(byte)c->tid,str);
      c = (bam1_core_t *)((long)&c->tid + 1);
    }
    if ((bam1_core_t *)(b->data + b->l_data) <= c) break;
    pbVar6 = (bam1_core_t *)((long)&c->tid + 1);
  }
  return -1;
}

Assistant:

int sam_format1(const bam_hdr_t *h, const bam1_t *b, kstring_t *str)
{
    int i;
    uint8_t *s;
    const bam1_core_t *c = &b->core;

    str->l = 0;
    kputsn(bam_get_qname(b), c->l_qname-1, str); kputc('\t', str); // query name
    kputw(c->flag, str); kputc('\t', str); // flag
    if (c->tid >= 0) { // chr
        kputs(h->target_name[c->tid] , str);
        kputc('\t', str);
    } else kputsn("*\t", 2, str);
    kputw(c->pos + 1, str); kputc('\t', str); // pos
    kputw(c->qual, str); kputc('\t', str); // qual
    if (c->n_cigar) { // cigar
        uint32_t *cigar = bam_get_cigar(b);
        for (i = 0; i < c->n_cigar; ++i) {
            kputw(bam_cigar_oplen(cigar[i]), str);
            kputc(bam_cigar_opchr(cigar[i]), str);
        }
    } else kputc('*', str);
    kputc('\t', str);
    if (c->mtid < 0) kputsn("*\t", 2, str); // mate chr
    else if (c->mtid == c->tid) kputsn("=\t", 2, str);
    else {
        kputs(h->target_name[c->mtid], str);
        kputc('\t', str);
    }
    kputw(c->mpos + 1, str); kputc('\t', str); // mate pos
    kputw(c->isize, str); kputc('\t', str); // template len
    if (c->l_qseq) { // seq and qual
        uint8_t *s = bam_get_seq(b);
        for (i = 0; i < c->l_qseq; ++i) kputc("=ACMGRSVTWYHKDBN"[bam_seqi(s, i)], str);
        kputc('\t', str);
        s = bam_get_qual(b);
        if (s[0] == 0xff) kputc('*', str);
        else for (i = 0; i < c->l_qseq; ++i) kputc(s[i] + 33, str);
    } else kputsn("*\t*", 3, str);
    s = bam_get_aux(b); // aux
    while (s+4 <= b->data + b->l_data) {
        uint8_t type, key[2];
        key[0] = s[0]; key[1] = s[1];
        s += 2; type = *s++;
        kputc('\t', str); kputsn((char*)key, 2, str); kputc(':', str);
        if (type == 'A') {
            kputsn("A:", 2, str);
            kputc(*s, str);
            ++s;
        } else if (type == 'C') {
            kputsn("i:", 2, str);
            kputw(*s, str);
            ++s;
        } else if (type == 'c') {
            kputsn("i:", 2, str);
            kputw(*(int8_t*)s, str);
            ++s;
        } else if (type == 'S') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(uint16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 's') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 'I') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputuw(*(uint32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'i') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'f') {
            if (s+4 <= b->data + b->l_data) {
                ksprintf(str, "f:%g", *(float*)s);
                s += 4;
            } else return -1;

        } else if (type == 'd') {
            if (s+8 <= b->data + b->l_data) {
                ksprintf(str, "d:%g", *(double*)s);
                s += 8;
            } else return -1;
        } else if (type == 'Z' || type == 'H') {
            kputc(type, str); kputc(':', str);
            while (s < b->data + b->l_data && *s) kputc(*s++, str);
            if (s >= b->data + b->l_data)
                return -1;
            ++s;
        } else if (type == 'B') {
            uint8_t sub_type = *(s++);
            int32_t n;
            memcpy(&n, s, 4);
            s += 4; // no point to the start of the array
            if (s + n >= b->data + b->l_data)
                return -1;
            kputsn("B:", 2, str); kputc(sub_type, str); // write the typing
            for (i = 0; i < n; ++i) { // FIXME: for better performance, put the loop after "if"
                kputc(',', str);
                if ('c' == sub_type)      { kputw(*(int8_t*)s, str); ++s; }
                else if ('C' == sub_type) { kputw(*(uint8_t*)s, str); ++s; }
                else if ('s' == sub_type) { kputw(*(int16_t*)s, str); s += 2; }
                else if ('S' == sub_type) { kputw(*(uint16_t*)s, str); s += 2; }
                else if ('i' == sub_type) { kputw(*(int32_t*)s, str); s += 4; }
                else if ('I' == sub_type) { kputuw(*(uint32_t*)s, str); s += 4; }
                else if ('f' == sub_type) { ksprintf(str, "%g", *(float*)s); s += 4; }
            }
        }
    }
    return str->l;
}